

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O3

bool __thiscall
re2::BitState::Search
          (BitState *this,StringPiece *text,StringPiece *context,bool anchored,bool longest,
          StringPiece *submatch,int nsubmatch)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  StringPiece *pSVar4;
  bool bVar5;
  int iVar6;
  uint __c;
  long lVar7;
  uint32 *__s;
  char **__s_00;
  Job *pJVar8;
  byte *p0;
  long lVar9;
  bool bVar10;
  int iVar11;
  ulong uVar12;
  byte *pbVar13;
  Prog *pPVar14;
  size_t __n;
  
  (this->text_).length_ = text->length_;
  (this->text_).ptr_ = text->ptr_;
  pcVar3 = context->ptr_;
  (this->context_).ptr_ = pcVar3;
  (this->context_).length_ = context->length_;
  if (pcVar3 == (char *)0x0) {
    (this->context_).length_ = text->length_;
    (this->context_).ptr_ = text->ptr_;
  }
  pPVar14 = this->prog_;
  bVar5 = pPVar14->anchor_start_;
  if (((bVar5 != true) || ((this->context_).ptr_ == text->ptr_)) &&
     ((bVar1 = pPVar14->anchor_end_, bVar1 != true ||
      ((this->context_).ptr_ + (this->context_).length_ == text->ptr_ + text->length_)))) {
    if (anchored) {
      bVar5 = true;
    }
    this->anchored_ = bVar5;
    bVar10 = bVar1;
    if (longest) {
      bVar10 = true;
    }
    this->longest_ = bVar10;
    this->endmatch_ = bVar1;
    this->submatch_ = submatch;
    this->nsubmatch_ = nsubmatch;
    if (0 < nsubmatch) {
      lVar7 = 8;
      lVar9 = 0;
      do {
        pSVar4 = this->submatch_;
        *(undefined8 *)((long)pSVar4 + lVar7 + -8) = 0;
        *(undefined4 *)((long)&pSVar4->ptr_ + lVar7) = 0;
        lVar9 = lVar9 + 1;
        lVar7 = lVar7 + 0x10;
      } while (lVar9 < this->nsubmatch_);
      pPVar14 = this->prog_;
    }
    iVar2 = text->length_;
    iVar6 = (iVar2 + 1) * pPVar14->size_;
    iVar11 = iVar6 + 0x3e;
    if (-1 < iVar6 + 0x1f) {
      iVar11 = iVar6 + 0x1f;
    }
    this->nvisited_ = iVar11 >> 5;
    __n = (long)(iVar11 >> 5) << 2;
    uVar12 = 0xffffffffffffffff;
    if (-0x3f < iVar6) {
      uVar12 = __n;
    }
    __s = (uint32 *)operator_new__(uVar12);
    this->visited_ = __s;
    memset(__s,0,__n);
    uVar12 = 2;
    if (0 < nsubmatch) {
      uVar12 = (ulong)(uint)(nsubmatch * 2);
    }
    this->ncap_ = (int)uVar12;
    __s_00 = (char **)operator_new__(uVar12 << 3);
    this->cap_ = __s_00;
    memset(__s_00,0,uVar12 << 3);
    this->maxjob_ = 0x100;
    pJVar8 = (Job *)operator_new__(0x1000);
    this->job_ = pJVar8;
    if (bVar5 != false) {
      pcVar3 = text->ptr_;
      *__s_00 = pcVar3;
      bVar5 = TrySearch(this,pPVar14->start_,pcVar3);
      return bVar5;
    }
    if (-1 < iVar2) {
      p0 = (byte *)text->ptr_;
      while( true ) {
        __c = Prog::first_byte(this->prog_);
        if ((((-1 < (int)__c) && (pbVar13 = (byte *)(text->ptr_ + text->length_), p0 < pbVar13)) &&
            (__c != *p0)) &&
           (p0 = (byte *)memchr(p0,__c,(long)pbVar13 - (long)p0), p0 == (byte *)0x0)) {
          p0 = pbVar13;
        }
        *this->cap_ = (char *)p0;
        bVar5 = TrySearch(this,this->prog_->start_,(char *)p0);
        if (bVar5) break;
        p0 = p0 + 1;
        if (text->ptr_ + text->length_ < p0) {
          return bVar5;
        }
      }
      return bVar5;
    }
  }
  return false;
}

Assistant:

bool BitState::Search(const StringPiece& text, const StringPiece& context,
                      bool anchored, bool longest,
                      StringPiece* submatch, int nsubmatch) {
  // Search parameters.
  text_ = text;
  context_ = context;
  if (context_.begin() == NULL)
    context_ = text;
  if (prog_->anchor_start() && context_.begin() != text.begin())
    return false;
  if (prog_->anchor_end() && context_.end() != text.end())
    return false;
  anchored_ = anchored || prog_->anchor_start();
  longest_ = longest || prog_->anchor_end();
  endmatch_ = prog_->anchor_end();
  submatch_ = submatch;
  nsubmatch_ = nsubmatch;
  for (int i = 0; i < nsubmatch_; i++)
    submatch_[i] = NULL;

  // Allocate scratch space.
  nvisited_ = (prog_->size() * (text.size()+1) + VisitedBits-1) / VisitedBits;
  visited_ = new uint32[nvisited_];
  memset(visited_, 0, nvisited_*sizeof visited_[0]);
  // VLOG(0) << "nvisited_ = " << nvisited_;

  ncap_ = 2*nsubmatch;
  if (ncap_ < 2)
    ncap_ = 2;
  cap_ = new const char*[ncap_];
  memset(cap_, 0, ncap_*sizeof cap_[0]);

  maxjob_ = 256;
  job_ = new Job[maxjob_];

  // Anchored search must start at text.begin().
  if (anchored_) {
    cap_[0] = text.begin();
    return TrySearch(prog_->start(), text.begin());
  }

  // Unanchored search, starting from each possible text position.
  // Notice that we have to try the empty string at the end of
  // the text, so the loop condition is p <= text.end(), not p < text.end().
  // This looks like it's quadratic in the size of the text,
  // but we are not clearing visited_ between calls to TrySearch,
  // so no work is duplicated and it ends up still being linear.
  for (const char* p = text.begin(); p <= text.end(); p++) {
    // Try to use memchr to find the first byte quickly.
    int fb = prog_->first_byte();
    if (fb >= 0 && p < text.end() && (p[0] & 0xFF) != fb) {
      p = reinterpret_cast<const char*>(memchr(p, fb, text.end() - p));
      if (p == NULL)
        p = text.end();
    }

    cap_[0] = p;
    if (TrySearch(prog_->start(), p))  // Match must be leftmost; done.
      return true;
  }
  return false;
}